

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool copyAndroidSources(Options *options)

{
  long lVar1;
  FILE *__stream;
  char cVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_48;
  QDir sourceDirectory;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((options->androidSourceDirectory).d.size == 0) {
    bVar3 = true;
  }
  else {
    if (options->verbose == true) {
      fwrite("Copying Android sources from project.\n",0x26,1,_stdout);
    }
    _sourceDirectory = 0xaaaaaaaaaaaaaaaa;
    QDir::QDir(&sourceDirectory,(QString *)&options->androidSourceDirectory);
    cVar2 = QDir::exists();
    __stream = _stderr;
    if (cVar2 == '\0') {
      QString::toLocal8Bit((QByteArray *)&QStack_48,&options->androidSourceDirectory);
      if (QStack_48.ptr == (char *)0x0) {
        QStack_48.ptr = (char *)&QByteArray::_empty;
      }
      bVar3 = false;
      fprintf(__stream,"Cannot find android sources in %s",QStack_48.ptr);
      QArrayDataPointer<char>::~QArrayDataPointer(&QStack_48);
    }
    else {
      QDir::QDir((QDir *)&QStack_48,(QString *)&options->outputDirectory);
      bVar3 = copyFiles(&sourceDirectory,(QDir *)&QStack_48,options,true);
      QDir::~QDir((QDir *)&QStack_48);
    }
    QDir::~QDir(&sourceDirectory);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool copyAndroidSources(const Options &options)
{
    if (options.androidSourceDirectory.isEmpty())
        return true;

    if (options.verbose)
        fprintf(stdout, "Copying Android sources from project.\n");

    QDir sourceDirectory(options.androidSourceDirectory);
    if (!sourceDirectory.exists()) {
        fprintf(stderr, "Cannot find android sources in %s", qPrintable(options.androidSourceDirectory));
        return false;
    }

    return copyFiles(sourceDirectory, QDir(options.outputDirectory), options, true);
}